

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::box::print(box *this)

{
  long lVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================");
  poVar2 = std::operator<<(poVar2,(string *)&this->box_type_);
  poVar2 = std::operator<<(poVar2,"==================");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," box size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void box::print() const
	{
		std::cout << "=================" << box_type_ << "==================" << std::endl;
		std::cout << std::setw(33) << std::left << " box size: " << size_ << std::endl;
	}